

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintChar(TidyDocImpl *doc,uint c,uint mode)

{
  TidyPrintImpl *pprint;
  int iVar1;
  int iVar2;
  _unicode4cat *p_Var3;
  uint uVar4;
  ctmbstr ptVar5;
  _unicode4cat *p_Var6;
  char *str;
  tmbchar entity [128];
  tmbchar atStack_a8 [136];
  
  pprint = &doc->pprint;
  iVar1 = *(int *)((doc->config).value + 0x3c);
  iVar2 = *(int *)((doc->config).value + 0x46);
  if ((mode & 0x17) == 0 && c == 0x20) {
    if ((mode & 8) == 0) {
      (doc->pprint).wraphere = (doc->pprint).linelen;
      goto LAB_0014c064;
    }
LAB_0014c131:
    if ((*(int *)((doc->config).value + 0x3a) == 0) && (*(int *)((doc->config).value + 0x67) == 0))
    {
      str = "&nbsp;";
    }
    else {
      str = "&#160;";
    }
LAB_0014c14c:
    AddString(pprint,str);
    return;
  }
LAB_0014c064:
  if ((mode & 0x12) != 0) goto switchD_0014c183_caseD_0;
  if (c == 0x26) {
    if (((*(int *)((doc->config).value + 0x45) != 0) && (mode != 4)) &&
       (*(int *)((doc->config).value + 0x40) == 0)) {
      str = anon_var_dwarf_50e43 + 0x2a;
      goto LAB_0014c14c;
    }
  }
  else {
    if (c == 0x3e) {
      str = "&gt;";
      goto LAB_0014c14c;
    }
    if (c == 0x3c) {
      str = "&lt;";
      goto LAB_0014c14c;
    }
  }
  if (iVar2 != 0 && c == 0x22) {
    str = "&quot;";
    goto LAB_0014c14c;
  }
  if (c == 0x27 && iVar2 != 0) {
    str = "&#39;";
    goto LAB_0014c14c;
  }
  if (iVar1 != 0 && c == 0xa0) {
    if (*(int *)((doc->config).value + 0x47) == 0) {
      c = 0xa0;
      goto LAB_0014c070;
    }
    goto LAB_0014c131;
  }
  switch(iVar1) {
  case 0:
  case 5:
  case 0xd:
    break;
  default:
switchD_0014c183_caseD_1:
    if (*(int *)((doc->config).value + 0x67) == 0) {
      if ((iVar1 == 1) && ((0x7e < c || (c != 9 && c < 0x20)))) goto LAB_0014c1f7;
    }
    else if (iVar1 == 1 && 0x7f < c) goto LAB_0014c2cf;
    break;
  case 3:
switchD_0014c183_caseD_3:
    if (0xff < c) {
LAB_0014c1f7:
      uVar4 = prvTidyHTMLVersion(doc);
      if ((*(int *)((doc->config).value + 0x3a) == 0) &&
         (ptVar5 = prvTidyEntityName(c,uVar4), ptVar5 != (ctmbstr)0x0)) {
        prvTidytmbsnprintf(atStack_a8,0x80,"&%s;",ptVar5);
      }
      else {
        prvTidytmbsnprintf(atStack_a8,0x80,"&#%u;",(ulong)c);
      }
      goto LAB_0014c353;
    }
    if (0x20 < c - 0x7f) break;
LAB_0014c2cf:
    prvTidytmbsnprintf(atStack_a8,0x80,"&#%u;",(ulong)c);
LAB_0014c353:
    AddString(pprint,atStack_a8);
    return;
  case 4:
  case 9:
  case 10:
  case 0xb:
    if (((mode & 1) == 0) && ((doc->config).value[0x43].v != 0)) {
      p_Var3 = unicode4cat;
      do {
        p_Var6 = p_Var3;
        if ((ulong)c <= p_Var6->code - 1) goto LAB_0014c1d0;
        p_Var3 = p_Var6 + 1;
      } while (p_Var6->code != (ulong)c);
      (doc->pprint).wraphere = (uint)((p_Var6->category & ~UCPC) != UCPS) + (doc->pprint).linelen;
    }
LAB_0014c1d0:
    if ((2 < iVar1 - 9U) && (iVar1 != 4)) {
      if (iVar1 == 3) goto switchD_0014c183_caseD_3;
      goto switchD_0014c183_caseD_1;
    }
    break;
  case 0xc:
    AddChar(pprint,c);
    if ((mode & 1) != 0) {
      return;
    }
    if ((c & 0xff00) != 0xa100) {
      return;
    }
    if ((doc->config).value[0x43].v == 0) {
      return;
    }
    uVar4 = (doc->pprint).linelen;
    if ((c & 1) == 0 || c - 0xa1ad < 0xffffffb0) {
      uVar4 = uVar4 + 1;
    }
    (doc->pprint).wraphere = uVar4;
    return;
  }
switchD_0014c183_caseD_0:
LAB_0014c070:
  AddChar(pprint,c);
  return;
}

Assistant:

static void PPrintChar( TidyDocImpl* doc, uint c, uint mode )
{
    tmbchar entity[128];
    ctmbstr p;
    TidyPrintImpl* pprint  = &doc->pprint;
    uint outenc = cfg( doc, TidyOutCharEncoding );
    Bool qmark = cfgBool( doc, TidyQuoteMarks );

    if ( c == ' ' && !(mode & (PREFORMATTED | COMMENT | ATTRIBVALUE | CDATA)))
    {
        /* coerce a space character to a non-breaking space */
        if (mode & NOWRAP)
        {
            ctmbstr ent = "&nbsp;";
            /* by default XML doesn't define &nbsp; */
            if ( cfgBool(doc, TidyNumEntities) || cfgBool(doc, TidyXmlTags) )
                ent = "&#160;";
            AddString( pprint, ent );
            return;
        }
        else
            pprint->wraphere = pprint->linelen;
    }

    /* comment characters are passed raw */
    if ( mode & (COMMENT | CDATA) )
    {
        AddChar( pprint, c );
        return;
    }

    /* except in CDATA map < to &lt; etc. */
    if ( !(mode & CDATA) )
    {
        if ( c == '<')
        {
            AddString( pprint, "&lt;" );
            return;
        }
            
        if ( c == '>')
        {
            AddString( pprint, "&gt;" );
            return;
        }

        /*
          naked '&' chars can be left alone or
          quoted as &amp; The latter is required
          for XML where naked '&' are illegal.
        */
        if ( c == '&' && cfgBool(doc, TidyQuoteAmpersand)
             && !cfgBool(doc, TidyPreserveEntities)
             && ( mode != OtherNamespace) ) /* #130 MathML attr and entity fix! */
        {
            AddString( pprint, "&amp;" );
            return;
        }

        if ( c == '"' && qmark )
        {
            AddString( pprint, "&quot;" );
            return;
        }

        if ( c == '\'' && qmark )
        {
            AddString( pprint, "&#39;" );
            return;
        }

        if ( c == 160 && outenc != RAW )
        {
            if ( cfgBool(doc, TidyQuoteNbsp) )
            {
                if ( cfgBool(doc, TidyNumEntities) ||
                     cfgBool(doc, TidyXmlTags) )
                    AddString( pprint, "&#160;" );
                else
                    AddString( pprint, "&nbsp;" );
            }
            else
                AddChar( pprint, c );
            return;
        }
    }

    /* #431953 - start RJ */
    /* Handle encoding-specific issues */
    switch ( outenc )
    {
    case UTF8:
    case UTF16:
    case UTF16LE:
    case UTF16BE:
        if (!(mode & PREFORMATTED) && cfg(doc, TidyPunctWrap))
        {
            WrapPoint wp = CharacterWrapPoint(c);
            if (wp == WrapBefore)
                pprint->wraphere = pprint->linelen;
            else if (wp == WrapAfter)
                pprint->wraphere = pprint->linelen + 1;
        }
        break;

    case BIG5:
        /* Allow linebreak at Chinese punctuation characters */
        /* There are not many spaces in Chinese */
        AddChar( pprint, c );
        if (!(mode & PREFORMATTED)  && cfg(doc, TidyPunctWrap))
        {
            WrapPoint wp = Big5WrapPoint(c);
            if (wp == WrapBefore)
                pprint->wraphere = pprint->linelen;
            else if (wp == WrapAfter)
                pprint->wraphere = pprint->linelen + 1;
        }
        return;

    case SHIFTJIS:
#ifndef NO_NATIVE_ISO2022_SUPPORT
    case ISO2022: /* ISO 2022 characters are passed raw */
#endif
    case RAW:
        AddChar( pprint, c );
        return;
    }

    /* don't map latin-1 chars to entities */
    if ( outenc == LATIN1 )
    {
        if (c > 255)  /* multi byte chars */
        {
            uint vers = TY_(HTMLVersion)( doc );
            if ( !cfgBool(doc, TidyNumEntities) && (p = TY_(EntityName)(c, vers)) )
                TY_(tmbsnprintf)(entity, sizeof(entity), "&%s;", p);
            else
                TY_(tmbsnprintf)(entity, sizeof(entity), "&#%u;", c);

            AddString( pprint, entity );
            return;
        }

        if (c > 126 && c < 160)
        {
            TY_(tmbsnprintf)(entity, sizeof(entity), "&#%u;", c);
            AddString( pprint, entity );
            return;
        }

        AddChar( pprint, c );
        return;
    }

    /* don't map UTF-8 chars to entities */
    if ( outenc == UTF8 )
    {
        AddChar( pprint, c );
        return;
    }

    /* don't map UTF-16 chars to entities */
    if ( outenc == UTF16 || outenc == UTF16LE || outenc == UTF16BE )
    {
        AddChar( pprint, c );
        return;
    }

    /* use numeric entities only  for XML */
    if ( cfgBool(doc, TidyXmlTags) )
    {
        /* if ASCII use numeric entities for chars > 127 */
        if ( c > 127 && outenc == ASCII )
        {
            TY_(tmbsnprintf)(entity, sizeof(entity), "&#%u;", c);
            AddString( pprint, entity );
            return;
        }

        /* otherwise output char raw */
        AddChar( pprint, c );
        return;
    }

    /* default treatment for ASCII */
    if ( outenc == ASCII && (c > 126 || (c < ' ' && c != '\t')) )
    {
        uint vers = TY_(HTMLVersion)( doc );
        if (!cfgBool(doc, TidyNumEntities) && (p = TY_(EntityName)(c, vers)) )
            TY_(tmbsnprintf)(entity, sizeof(entity), "&%s;", p);
        else
            TY_(tmbsnprintf)(entity, sizeof(entity), "&#%u;", c);

        AddString( pprint, entity );
        return;
    }

    AddChar( pprint, c );
}